

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGenerate.cpp
# Opt level: O2

int __thiscall luna::CodeGenerateVisitor::PrepareUpvalue(CodeGenerateVisitor *this,String *name)

{
  Function *this_00;
  GenerateFunction *function;
  String *pSVar1;
  int iVar2;
  int iVar3;
  _Elt_pointer ppGVar4;
  LocalNameInfo *pLVar5;
  CodeGenerateException *pCVar6;
  bool parent_local;
  anon_union_16_2_eed97686_for_String_2 *paVar7;
  stack<luna::GenerateFunction_*,_std::deque<luna::GenerateFunction_*,_std::allocator<luna::GenerateFunction_*>_>_>
  parents;
  
  this_00 = this->current_function_->function_;
  iVar2 = Function::SearchUpvalue(this_00,name);
  if (-1 < iVar2) {
    return iVar2;
  }
  std::
  stack<luna::GenerateFunction*,std::deque<luna::GenerateFunction*,std::allocator<luna::GenerateFunction*>>>
  ::stack<std::deque<luna::GenerateFunction*,std::allocator<luna::GenerateFunction*>>,void>
            (&parents);
  std::deque<luna::GenerateFunction_*,_std::allocator<luna::GenerateFunction_*>_>::push_back
            (&parents.c,&this->current_function_->parent_);
  iVar2 = -1;
  parent_local = false;
  do {
    while( true ) {
      if (parents.c.
          super__Deque_base<luna::GenerateFunction_*,_std::allocator<luna::GenerateFunction_*>_>.
          _M_impl.super__Deque_impl_data._M_finish._M_cur ==
          parents.c.
          super__Deque_base<luna::GenerateFunction_*,_std::allocator<luna::GenerateFunction_*>_>.
          _M_impl.super__Deque_impl_data._M_start._M_cur) {
        if (iVar2 < 0) {
          __assert_fail("register_index >= 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/CodeGenerate.cpp"
                        ,0x184,"int luna::CodeGenerateVisitor::PrepareUpvalue(String *) const");
        }
        iVar2 = Function::AddUpvalue(this_00,name,parent_local,iVar2);
        if (iVar2 < 0xfa) {
          std::_Deque_base<luna::GenerateFunction_*,_std::allocator<luna::GenerateFunction_*>_>::
          ~_Deque_base((_Deque_base<luna::GenerateFunction_*,_std::allocator<luna::GenerateFunction_*>_>
                        *)&parents);
          return iVar2;
        }
        pCVar6 = (CodeGenerateException *)__cxa_allocate_exception(0x20);
        pSVar1 = this_00->module_;
        if ((pSVar1->super_GCObject).field_0x11 == '\0') {
          paVar7 = &pSVar1->field_1;
        }
        else {
          paVar7 = (anon_union_16_2_eed97686_for_String_2 *)(pSVar1->field_1).str_;
        }
        CodeGenerateException::CodeGenerateException<char_const(&)[30]>
                  (pCVar6,paVar7->str_buffer_,this_00->line_,
                   (char (*) [30])"too many upvalues in function");
        __cxa_throw(pCVar6,&CodeGenerateException::typeinfo,Exception::~Exception);
      }
      ppGVar4 = parents.c.
                super__Deque_base<luna::GenerateFunction_*,_std::allocator<luna::GenerateFunction_*>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_cur;
      if (parents.c.
          super__Deque_base<luna::GenerateFunction_*,_std::allocator<luna::GenerateFunction_*>_>.
          _M_impl.super__Deque_impl_data._M_finish._M_cur ==
          parents.c.
          super__Deque_base<luna::GenerateFunction_*,_std::allocator<luna::GenerateFunction_*>_>.
          _M_impl.super__Deque_impl_data._M_finish._M_first) {
        ppGVar4 = parents.c.
                  super__Deque_base<luna::GenerateFunction_*,_std::allocator<luna::GenerateFunction_*>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
      }
      function = ppGVar4[-1];
      if (function == (GenerateFunction *)0x0) {
        __assert_fail("current",
                      "/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/CodeGenerate.cpp"
                      ,0x157,"int luna::CodeGenerateVisitor::PrepareUpvalue(String *) const");
      }
      if (iVar2 < 0) break;
      iVar2 = Function::AddUpvalue(function->function_,name,parent_local,iVar2);
      if (0xf9 < iVar2) {
        pCVar6 = (CodeGenerateException *)__cxa_allocate_exception(0x20);
        pSVar1 = function->function_->module_;
        if ((pSVar1->super_GCObject).field_0x11 == '\0') {
          paVar7 = &pSVar1->field_1;
        }
        else {
          paVar7 = (anon_union_16_2_eed97686_for_String_2 *)(pSVar1->field_1).str_;
        }
        CodeGenerateException::CodeGenerateException<char_const(&)[30]>
                  (pCVar6,paVar7->str_buffer_,function->function_->line_,
                   (char (*) [30])"too many upvalues in function");
        __cxa_throw(pCVar6,&CodeGenerateException::typeinfo,Exception::~Exception);
      }
      parent_local = false;
LAB_0016f7bd:
      std::deque<luna::GenerateFunction_*,_std::allocator<luna::GenerateFunction_*>_>::pop_back
                (&parents.c);
    }
    pLVar5 = SearchFunctionLocalName(this,function,name);
    if (pLVar5 != (LocalNameInfo *)0x0) {
      iVar2 = pLVar5->register_id_;
      parent_local = true;
      goto LAB_0016f7bd;
    }
    iVar3 = Function::SearchUpvalue(function->function_,name);
    if (-1 < iVar3) {
      parent_local = false;
      iVar2 = iVar3;
      goto LAB_0016f7bd;
    }
    std::deque<luna::GenerateFunction_*,_std::allocator<luna::GenerateFunction_*>_>::push_back
              (&parents.c,&function->parent_);
  } while( true );
}

Assistant:

int PrepareUpvalue(String *name) const
        {
            // If the upvalue info existed, then return the index of the upvalue
            auto function = GetCurrentFunction();
            auto index = function->SearchUpvalue(name);
            if (index >= 0)
                return index;

            // Search start from parent
            std::stack<GenerateFunction *> parents;
            parents.push(current_function_->parent_);

            int register_index = -1;
            bool parent_local = false;
            while (!parents.empty())
            {
                auto current = parents.top();
                assert(current);
                if (register_index >= 0)
                {
                    // Find it, add it as upvalue to function,
                    // and continue backtrack
                    auto index = current->function_->AddUpvalue(name, parent_local,
                                                                register_index);
                    CHECK_UPVALUE_MAX_COUNT(index, current->function_);
                    register_index = index;
                    parent_local = false;
                    parents.pop();
                }
                else
                {
                    // Find name from local names
                    auto name_info = SearchFunctionLocalName(current, name);
                    if (name_info)
                    {
                        // Find it, get its register_id and start backtrack
                        register_index = name_info->register_id_;
                        parent_local = true;
                        parents.pop();
                    }
                    else
                    {
                        // Find it from current function upvalue list
                        auto index = current->function_->SearchUpvalue(name);
                        if (index >= 0)
                        {
                            // Find it, the name upvalue has been inserted,
                            // then get the upvalue index, and start backtrack
                            register_index = index;
                            parent_local = false;
                            parents.pop();
                        }
                        else
                        {
                            // Not find it, continue to search its parent
                            parents.push(current->parent_);
                        }
                    }
                }
            }

            // Add it as upvalue to current function
            assert(register_index >= 0);
            index = function->AddUpvalue(name, parent_local, register_index);
            CHECK_UPVALUE_MAX_COUNT(index, function);
            return index;
        }